

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O3

int Hsh_IntManAdd(Hsh_IntMan_t *p,int iData)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  word *pwVar10;
  int iVar11;
  ulong uVar12;
  int *piVar13;
  uint uVar14;
  ulong uVar16;
  undefined4 in_register_00000034;
  long lVar17;
  Vec_Wrd_t *pVVar18;
  uchar *pDataC;
  ulong uVar15;
  
  pVVar3 = p->vTable;
  pVVar18 = p->vObjs;
  iVar11 = pVVar18->nSize;
  if (pVVar3->nSize < iVar11) {
    uVar16 = (ulong)(pVVar3->nSize * 2 - 1);
    while( true ) {
      do {
        uVar7 = (uint)uVar16;
        uVar14 = uVar7 + 1;
        uVar15 = (ulong)uVar14;
        uVar12 = uVar16 & 1;
        uVar16 = uVar15;
      } while (uVar12 != 0);
      if (uVar14 < 9) break;
      iVar11 = 5;
      while (uVar14 % (iVar11 - 2U) != 0) {
        uVar6 = iVar11 * iVar11;
        iVar11 = iVar11 + 2;
        if (uVar14 < uVar6) goto LAB_004f3e55;
      }
    }
LAB_004f3e55:
    if (pVVar3->nCap < (int)uVar14) {
      if (pVVar3->pArray == (int *)0x0) {
        piVar9 = (int *)malloc((long)(int)uVar14 << 2);
      }
      else {
        piVar9 = (int *)realloc(pVVar3->pArray,(long)(int)uVar14 << 2);
      }
      pVVar3->pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar3->nCap = uVar14;
    }
    if (uVar7 < 0x7fffffff) {
      memset(pVVar3->pArray,0xff,uVar15 << 2);
    }
    pVVar3->nSize = uVar14;
    pVVar18 = p->vObjs;
    iVar11 = pVVar18->nSize;
    if (0 < iVar11) {
      pVVar3 = p->vData;
      pVVar4 = p->vTable;
      lVar17 = 0;
      do {
        iVar11 = p->nSize;
        uVar7 = iVar11 * (int)lVar17;
        if (((int)uVar7 < 0) || (pVVar3->nSize <= (int)uVar7)) goto LAB_004f41a7;
        if (iVar11 < 1) {
          uVar14 = 0;
        }
        else {
          uVar6 = iVar11 * 4;
          if (iVar11 * 4 < 2) {
            uVar6 = 1;
          }
          uVar16 = 0;
          uVar14 = 0;
          do {
            uVar14 = uVar14 + (uint)*(byte *)((long)pVVar3->pArray + uVar16 + (ulong)uVar7 * 4) *
                              (&Hsh_IntManHash_s_Primes)[uVar16 % 7];
            uVar16 = uVar16 + 1;
          } while (uVar6 != uVar16);
        }
        uVar7 = pVVar4->nSize;
        uVar16 = (ulong)uVar14 % (ulong)uVar7;
        if (((int)uVar16 < 0) || ((int)uVar7 <= (int)uVar16)) goto LAB_004f41a7;
        piVar9 = pVVar4->pArray;
        *(int *)((long)pVVar18->pArray + lVar17 * 8 + 4) = piVar9[uVar16];
        piVar9[uVar16] = (int)lVar17;
        lVar17 = lVar17 + 1;
        iVar11 = pVVar18->nSize;
      } while (lVar17 < iVar11);
    }
  }
  iVar1 = p->nSize;
  uVar7 = iVar1 * iData;
  if (-1 < (int)uVar7) {
    iVar2 = p->vData->nSize;
    if ((int)uVar7 < iVar2) {
      piVar5 = p->vData->pArray;
      piVar9 = piVar5 + uVar7;
      uVar7 = p->vTable->nSize;
      if (iVar1 < 1) {
        uVar14 = 0;
      }
      else {
        uVar16 = 1;
        if (1 < iVar1 * 4) {
          uVar16 = (ulong)(uint)(iVar1 * 4);
        }
        uVar12 = 0;
        uVar14 = 0;
        do {
          uVar14 = uVar14 + (uint)*(byte *)((long)piVar9 + uVar12) *
                            (&Hsh_IntManHash_s_Primes)[uVar12 % 7];
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
      }
      uVar16 = (ulong)uVar14 % (ulong)uVar7;
      if ((-1 < (int)uVar16) && ((int)uVar16 < (int)uVar7)) {
        piVar13 = p->vTable->pArray;
        uVar7 = piVar13[uVar16];
        if (uVar7 == 0xffffffff) {
          piVar13 = piVar13 + uVar16;
        }
        else {
          do {
            if (((int)uVar7 < 0) || (iVar11 <= (int)uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                            ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            if (pVVar18->pArray == (word *)0x0) {
              __assert_fail("*pPlace == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecHsh.h"
                            ,0x9a,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
            }
            pwVar10 = pVVar18->pArray + uVar7;
            uVar14 = (int)*pwVar10 * iVar1;
            if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_004f41a7;
            iVar8 = bcmp(piVar9,piVar5 + uVar14,(long)iVar1 * 4);
            if (iVar8 == 0) {
              return uVar7;
            }
            uVar7 = *(uint *)((long)pwVar10 + 4);
          } while (uVar7 != 0xffffffff);
          piVar13 = (int *)((long)pwVar10 + 4);
        }
        *piVar13 = iVar11;
        uVar7 = pVVar18->nSize;
        if (uVar7 == pVVar18->nCap) {
          if ((int)uVar7 < 0x10) {
            if (pVVar18->pArray == (word *)0x0) {
              pwVar10 = (word *)malloc(0x80);
            }
            else {
              pwVar10 = (word *)realloc(pVVar18->pArray,0x80);
            }
            pVVar18->pArray = pwVar10;
            if (pwVar10 == (word *)0x0) {
LAB_004f4204:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                            ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar18->nCap = 0x10;
          }
          else {
            if (pVVar18->pArray == (word *)0x0) {
              pwVar10 = (word *)malloc((ulong)uVar7 << 4);
            }
            else {
              pwVar10 = (word *)realloc(pVVar18->pArray,(ulong)uVar7 << 4);
            }
            pVVar18->pArray = pwVar10;
            if (pwVar10 == (word *)0x0) goto LAB_004f4204;
            pVVar18->nCap = uVar7 * 2;
          }
        }
        else {
          pwVar10 = pVVar18->pArray;
        }
        iVar11 = pVVar18->nSize;
        pVVar18->nSize = iVar11 + 1;
        pwVar10[iVar11] = CONCAT44(in_register_00000034,iData) | 0xffffffff00000000;
        return p->vObjs->nSize + -1;
      }
    }
  }
LAB_004f41a7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int Hsh_IntManAdd( Hsh_IntMan_t * p, int iData )
{
    int i, * pPlace;
    if ( Vec_WrdSize(p->vObjs) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_WrdSize(p->vObjs); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(Hsh_IntData(p, i), p->nSize, Vec_IntSize(p->vTable)) );
            Hsh_IntObj(p, i)->iNext = *pPlace;  *pPlace = i;
        }
    }
    pPlace = Hsh_IntManLookup( p, Hsh_IntData(p, iData) );
    if ( *pPlace == -1 )
    {
        *pPlace = Vec_WrdSize(p->vObjs);
        Vec_WrdPush( p->vObjs, Hsh_IntWord(iData, -1) );
        return Vec_WrdSize(p->vObjs) - 1;
    }
    return (word *)Hsh_IntObj(p, *pPlace) - Vec_WrdArray(p->vObjs);
}